

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AppLayout.cpp
# Opt level: O3

bool __thiscall cursespp::AppLayout::KeyPress(AppLayout *this,string *key)

{
  element_type *peVar1;
  char cVar2;
  int iVar3;
  int iVar4;
  long *plVar5;
  AppLayout *pAVar6;
  byte bVar7;
  AppLayout *local_50;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_48;
  IDisplayable local_38;
  undefined4 extraout_var;
  
  iVar3 = (*(((this->shortcuts).
              super___shared_ptr<cursespp::ShortcutsWindow,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            super_Window).super_IWindow.super_IOrderable._vptr_IOrderable[0x24])();
  iVar4 = std::__cxx11::string::compare((char *)key);
  bVar7 = (byte)iVar3;
  if (((iVar4 == 0) ||
      (iVar3 = std::__cxx11::string::compare((char *)key), (bVar7 & iVar3 == 0) != 0)) ||
     (iVar3 = std::__cxx11::string::compare((char *)key), bVar7 == 1 && iVar3 == 0)) {
    if (bVar7 != 0) {
      BlurShortcuts((AppLayout *)&stack0xffffffffffffffc0);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38._vptr_IDisplayable !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38._vptr_IDisplayable);
        return true;
      }
      return true;
    }
    FocusShortcuts(this);
  }
  else {
    if (bVar7 != 0) {
      iVar3 = std::__cxx11::string::compare((char *)key);
      if (iVar3 == 0) {
        return true;
      }
      iVar3 = std::__cxx11::string::compare((char *)key);
      if (iVar3 == 0) {
        return true;
      }
      iVar3 = std::__cxx11::string::compare((char *)key);
      if (iVar3 == 0) {
        return true;
      }
      iVar3 = std::__cxx11::string::compare((char *)key);
      if (iVar3 == 0) {
        return true;
      }
    }
    peVar1 = (this->layout).super___shared_ptr<cursespp::LayoutBase,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    iVar3 = (*(peVar1->super_Window).super_IWindow.super_IOrderable._vptr_IOrderable[0x45])
                      (peVar1,key);
    if ((char)iVar3 == '\0') {
      (*(((this->layout).super___shared_ptr<cursespp::LayoutBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         )->super_Window).super_IWindow.super_IOrderable._vptr_IOrderable[0x3a])(&local_50);
      if (local_48 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48);
      }
      pAVar6 = local_50;
      if (local_50 == this || local_50 == (AppLayout *)0x0) {
        return false;
      }
      while ((plVar5 = (long *)__dynamic_cast(pAVar6,&IWindow::typeinfo,&IKeyHandler::typeinfo,
                                              0xfffffffffffffffe), plVar5 == (long *)0x0 ||
             (cVar2 = (**(code **)(*plVar5 + 0x10))(plVar5,key), cVar2 == '\0'))) {
        iVar3 = (*(pAVar6->super_LayoutBase).super_Window.super_IWindow.super_IOrderable.
                  _vptr_IOrderable[0x25])(pAVar6);
        pAVar6 = (AppLayout *)CONCAT44(extraout_var,iVar3);
        if (pAVar6 == (AppLayout *)0x0) {
          return false;
        }
        if (pAVar6 == this) {
          return false;
        }
      }
    }
  }
  return true;
}

Assistant:

bool AppLayout::KeyPress(const std::string& key) {
    /* otherwise, see if the user is monkeying around with the
    shortcut bar focus... */
    const auto shortcutsFocused = this->shortcuts->IsFocused();
    if (key == "^["  ||
        (key == "KEY_ENTER" && shortcutsFocused) ||
        (key == "KEY_UP" && shortcutsFocused))
    {
        if (shortcutsFocused) {
            this->BlurShortcuts();
        }
        else {
            this->FocusShortcuts();
        }
        return true;
    }

    if (shortcutsFocused) {
        if (key == "KEY_DOWN" || key == "KEY_LEFT" ||
            key == "KEY_UP" || key == "KEY_RIGHT")
        {
            /* layouts allow focusing via TAB and sometimes arrow
            keys. suppress these from bubbling. */
            return true;
        }
    }

    /* otherwise, pass along to our child layout */
    if (this->layout->KeyPress(key)) {
        return true;
    }

    /* the child layout didn't handle it directly, so let's walk
    up the parent hierarchy to see if there's someone who can. */
    auto focus = this->layout->GetFocus().get();
    while (focus != nullptr && focus != this) {
        auto asKeyHandler = dynamic_cast<IKeyHandler*>(focus);
        if (asKeyHandler) {
            if (asKeyHandler->KeyPress(key)) {
                return true;
            }
        }
        focus = focus->GetParent();
    }

    return false;
}